

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryGLImpl.cpp
# Opt level: O2

bool __thiscall
Diligent::QueryGLImpl::GetData(QueryGLImpl *this,void *pData,Uint32 DataSize,bool AutoInvalidate)

{
  QUERY_TYPE QVar1;
  uint *Args_1;
  bool bVar2;
  GLenum err_1;
  GLenum err;
  uint uStack_64;
  void *local_60;
  GLuint ResultAvailable;
  string msg;
  
  QueryBase<Diligent::EngineGLImplTraits>::CheckQueryDataPtr
            (&this->super_QueryBase<Diligent::EngineGLImplTraits>,pData,DataSize);
  ResultAvailable = 0;
  if ((this->super_QueryBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>.
      m_Desc.Type - QUERY_TYPE_OCCLUSION < 5) {
    (*__glewGetQueryObjectuiv)
              (*(GLuint *)&(this->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44,0x8867,
               &ResultAvailable);
    err = glGetError();
    if (err != 0) {
      local_60 = pData;
      LogError<false,char[27],char[17],unsigned_int>
                (false,"GetData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                 ,0x4f,(char (*) [27])"Failed to get query result",
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                 ,0x4f);
      std::__cxx11::string::~string((string *)&msg);
      pData = local_60;
    }
    if ((pData != (void *)0x0) && (ResultAvailable != 0)) {
      Args_1 = &switchD_0017c1ea::switchdataD_002c4aa4;
      switch((this->super_QueryBase<Diligent::EngineGLImplTraits>).
             super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
             .m_Desc.Type) {
      case QUERY_TYPE_OCCLUSION:
        _err = (ulong)uStack_64 << 0x20;
        (*__glewGetQueryObjectuiv)
                  (*(GLuint *)&(this->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44,
                   0x8866,&err);
        err_1 = glGetError();
        local_60 = pData;
        if (err_1 != 0) {
          LogError<false,char[27],char[17],unsigned_int>
                    (false,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x60,(char (*) [27])"Failed to get query result",
                     (char (*) [17])"\nGL Error Code: ",&err_1);
          FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x60);
          std::__cxx11::string::~string((string *)&msg);
        }
        *(GLuint64 *)((long)local_60 + 8) = _err & 0xffffffff;
        break;
      case QUERY_TYPE_BINARY_OCCLUSION:
        _err = (ulong)uStack_64 << 0x20;
        (*__glewGetQueryObjectuiv)
                  (*(GLuint *)&(this->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44,
                   0x8866,&err);
        err_1 = glGetError();
        local_60 = pData;
        if (err_1 != 0) {
          LogError<false,char[27],char[17],unsigned_int>
                    (false,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x6b,(char (*) [27])"Failed to get query result",
                     (char (*) [17])"\nGL Error Code: ",&err_1);
          FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x6b);
          std::__cxx11::string::~string((string *)&msg);
        }
        *(bool *)((long)local_60 + 4) = err != 0;
        break;
      case QUERY_TYPE_TIMESTAMP:
      case QUERY_TYPE_DURATION:
        if (__glewGetQueryObjectui64v != (PFNGLGETQUERYOBJECTUI64VPROC)0x0) {
          _err = 0;
          (*__glewGetQueryObjectui64v)
                    (*(GLuint *)&(this->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44,
                     0x8866,(GLuint64 *)&err);
          err_1 = glGetError();
          if (err_1 != 0) {
            LogError<false,char[27],char[17],unsigned_int>
                      (false,"GetData",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                       ,0x82,(char (*) [27])"Failed to get query result",
                       (char (*) [17])"\nGL Error Code: ",&err_1);
            FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
            Args_1 = (uint *)0x82;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"GetData",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                       ,0x82);
            std::__cxx11::string::~string((string *)&msg);
          }
          QVar1 = (this->super_QueryBase<Diligent::EngineGLImplTraits>).
                  super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
                  .m_Desc.Type;
          if ((QVar1 != QUERY_TYPE_TIMESTAMP) && (QVar1 != QUERY_TYPE_DURATION)) {
            FormatString<char[26],char[35]>
                      (&msg,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"m_Desc.Type == QUERY_TYPE_DURATION",(char (*) [35])Args_1);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"GetData",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                       ,0x8c);
            std::__cxx11::string::~string((string *)&msg);
          }
          *(GLuint64 *)((long)pData + 8) = _err;
          *(undefined8 *)((long)pData + 0x10) = 1000000000;
        }
        break;
      case QUERY_TYPE_PIPELINE_STATISTICS:
        _err = (ulong)uStack_64 << 0x20;
        (*__glewGetQueryObjectuiv)
                  (*(GLuint *)&(this->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44,
                   0x8866,&err);
        err_1 = glGetError();
        local_60 = pData;
        if (err_1 != 0) {
          LogError<false,char[27],char[17],unsigned_int>
                    (false,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x76,(char (*) [27])"Failed to get query result",
                     (char (*) [17])"\nGL Error Code: ",&err_1);
          FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x76);
          std::__cxx11::string::~string((string *)&msg);
        }
        *(GLuint64 *)((long)local_60 + 0x20) = _err & 0xffffffff;
        break;
      default:
        FormatString<char[22]>(&msg,(char (*) [22])"Unexpected query type");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"GetData",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                   ,0x97);
        std::__cxx11::string::~string((string *)&msg);
        goto LAB_0017c51d;
      }
      if (AutoInvalidate) {
        (this->super_QueryBase<Diligent::EngineGLImplTraits>).m_State = Inactive;
      }
    }
    bVar2 = ResultAvailable != 0;
  }
  else {
LAB_0017c51d:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool QueryGLImpl::GetData(void* pData, Uint32 DataSize, bool AutoInvalidate)
{
    TQueryBase::CheckQueryDataPtr(pData, DataSize);

    GLuint ResultAvailable = GL_FALSE;

    switch (m_Desc.Type)
    {
#if GL_SAMPLES_PASSED
        case QUERY_TYPE_OCCLUSION:
#endif

        case QUERY_TYPE_BINARY_OCCLUSION:

#if GL_PRIMITIVES_GENERATED
        case QUERY_TYPE_PIPELINE_STATISTICS:
#endif

        case QUERY_TYPE_DURATION:
        case QUERY_TYPE_TIMESTAMP:
            glGetQueryObjectuiv(m_GlQuery, GL_QUERY_RESULT_AVAILABLE, &ResultAvailable);
            DEV_CHECK_GL_ERROR("Failed to get query result");
            break;

        default:
            return false;
    }

    if (ResultAvailable && pData != nullptr)
    {
        switch (m_Desc.Type)
        {
            case QUERY_TYPE_OCCLUSION:
            {
                auto& QueryData = *reinterpret_cast<QueryDataOcclusion*>(pData);

                GLuint SamplesPassed = 0;
                glGetQueryObjectuiv(m_GlQuery, GL_QUERY_RESULT, &SamplesPassed);
                DEV_CHECK_GL_ERROR("Failed to get query result");
                QueryData.NumSamples = SamplesPassed;
            }
            break;

            case QUERY_TYPE_BINARY_OCCLUSION:
            {
                auto& QueryData = *reinterpret_cast<QueryDataBinaryOcclusion*>(pData);

                GLuint AnySamplePassed = 0;
                glGetQueryObjectuiv(m_GlQuery, GL_QUERY_RESULT, &AnySamplePassed);
                DEV_CHECK_GL_ERROR("Failed to get query result");
                QueryData.AnySamplePassed = AnySamplePassed != 0;
            }
            break;

            case QUERY_TYPE_PIPELINE_STATISTICS:
            {
                auto& QueryData = *reinterpret_cast<QueryDataPipelineStatistics*>(pData);

                GLuint PrimitivesGenerated = 0;
                glGetQueryObjectuiv(m_GlQuery, GL_QUERY_RESULT, &PrimitivesGenerated);
                DEV_CHECK_GL_ERROR("Failed to get query result");
                QueryData.ClippingInvocations = PrimitivesGenerated;
            }
            break;

            case QUERY_TYPE_TIMESTAMP:
            case QUERY_TYPE_DURATION:
            {
                if (glGetQueryObjectui64v != nullptr)
                {
                    GLuint64 Counter = 0;
                    glGetQueryObjectui64v(m_GlQuery, GL_QUERY_RESULT, &Counter);
                    DEV_CHECK_GL_ERROR("Failed to get query result");
                    if (m_Desc.Type == QUERY_TYPE_TIMESTAMP)
                    {
                        auto& QueryData   = *reinterpret_cast<QueryDataTimestamp*>(pData);
                        QueryData.Counter = Counter;
                        // Counter is always measured in nanoseconds (10^-9 seconds)
                        QueryData.Frequency = 1000000000;
                    }
                    else
                    {
                        VERIFY_EXPR(m_Desc.Type == QUERY_TYPE_DURATION);
                        auto& QueryData    = *reinterpret_cast<QueryDataDuration*>(pData);
                        QueryData.Duration = Counter;
                        // Counter is always measured in nanoseconds (10^-9 seconds)
                        QueryData.Frequency = 1000000000;
                    }
                }
            }
            break;

            default:
                UNEXPECTED("Unexpected query type");
                return false;
        }

        if (AutoInvalidate)
        {
            Invalidate();
        }
    }

    return ResultAvailable != GL_FALSE;
}